

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5SentenceFinderCb
              (void *pContext,int tflags,char *pToken,int nToken,int iStartOff,int iEndOff)

{
  char local_3d;
  int local_3c;
  char c;
  int i;
  Fts5SFinder *p;
  int rc;
  int iEndOff_local;
  int iStartOff_local;
  int nToken_local;
  char *pToken_local;
  int tflags_local;
  void *pContext_local;
  
  p._0_4_ = 0;
  if ((tflags & 1U) == 0) {
    if (*pContext < 1) {
      p._0_4_ = fts5SentenceFinderAdd((Fts5SFinder *)pContext,0);
    }
    else {
      local_3d = '\0';
      for (local_3c = iStartOff + -1;
          (-1 < local_3c &&
          ((((local_3d = *(char *)(*(long *)((long)pContext + 0x18) + (long)local_3c),
             local_3d == ' ' || (local_3d == '\t')) || (local_3d == '\n')) || (local_3d == '\r'))));
          local_3c = local_3c + -1) {
      }
      if ((local_3c != iStartOff + -1) && ((local_3d == '.' || (local_3d == ':')))) {
        p._0_4_ = fts5SentenceFinderAdd((Fts5SFinder *)pContext,*pContext);
      }
    }
    *(int *)pContext = *pContext + 1;
  }
  return (int)p;
}

Assistant:

static int fts5SentenceFinderCb(
  void *pContext,                 /* Pointer to HighlightContext object */
  int tflags,                     /* Mask of FTS5_TOKEN_* flags */
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iStartOff,                  /* Start offset of token */
  int iEndOff                     /* End offset of token */
){
  int rc = SQLITE_OK;

  UNUSED_PARAM2(pToken, nToken);
  UNUSED_PARAM(iEndOff);

  if( (tflags & FTS5_TOKEN_COLOCATED)==0 ){
    Fts5SFinder *p = (Fts5SFinder*)pContext;
    if( p->iPos>0 ){
      int i;
      char c = 0;
      for(i=iStartOff-1; i>=0; i--){
        c = p->zDoc[i];
        if( c!=' ' && c!='\t' && c!='\n' && c!='\r' ) break;
      }
      if( i!=iStartOff-1 && (c=='.' || c==':') ){
        rc = fts5SentenceFinderAdd(p, p->iPos);
      }
    }else{
      rc = fts5SentenceFinderAdd(p, 0);
    }
    p->iPos++;
  }
  return rc;
}